

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int pushresult(lua_State *L,int i,char *filename)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  TValue *i_o;
  StkId pTVar4;
  
  piVar2 = __errno_location();
  pTVar4 = L->top;
  if (i == 0) {
    iVar1 = *piVar2;
    pTVar4->tt = 0;
    L->top = pTVar4 + 1;
    pcVar3 = strerror(iVar1);
    if (filename == (char *)0x0) {
      lua_pushfstring(L,"%s",pcVar3);
    }
    else {
      lua_pushfstring(L,"%s: %s",filename,pcVar3);
    }
    pTVar4 = L->top;
    (pTVar4->value).n = (double)iVar1;
    iVar1 = 3;
  }
  else {
    (pTVar4->value).b = 1;
    iVar1 = 1;
  }
  pTVar4->tt = iVar1;
  L->top = L->top + 1;
  return iVar1;
}

Assistant:

static int pushresult(lua_State*L,int i,const char*filename){
int en=errno;
if(i){
lua_pushboolean(L,1);
return 1;
}
else{
lua_pushnil(L);
if(filename)
lua_pushfstring(L,"%s: %s",filename,strerror(en));
else
lua_pushfstring(L,"%s",strerror(en));
lua_pushinteger(L,en);
return 3;
}
}